

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O3

void __thiscall xLearn::OndiskReader::Initialize(OndiskReader *this,string *filename)

{
  Parser *pPVar1;
  char *pcVar2;
  FILE *pFVar3;
  ostream *poVar4;
  Logger local_64;
  string local_60;
  string local_40;
  
  if (filename->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&(this->super_Reader).filename_);
    Reader::check_file_format_abi_cxx11_(&local_60,&this->super_Reader);
    pPVar1 = Reader::CreateParser(&this->super_Reader,local_60._M_dataplus._M_p);
    (this->super_Reader).parser_ = pPVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    pPVar1 = (this->super_Reader).parser_;
    pPVar1->has_label_ = (this->super_Reader).has_label_;
    std::__cxx11::string::_M_assign((string *)&pPVar1->splitor_);
    pcVar2 = (char *)malloc((this->super_Reader).block_size_ << 0x14);
    (this->super_Reader).block_ = pcVar2;
    pFVar3 = OpenFileOrDie((this->super_Reader).filename_._M_dataplus._M_p,"r");
    this->file_ptr_ = pFVar3;
    return;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_64.severity_ = ERR;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader.cc"
             ,"");
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Initialize","");
  poVar4 = Logger::Start(ERR,&local_60,0x120,&local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK_NE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader.cc"
             ,0x57);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x120);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"filename.empty()",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"true",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  Logger::~Logger(&local_64);
  abort();
}

Assistant:

void OndiskReader::Initialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
  this->filename_ = filename;
  // Init parser_                                 
  parser_ = CreateParser(check_file_format().c_str());
  if (has_label_) parser_->setLabel(true);
  else parser_->setLabel(false);
  // Set splitor
  parser_->setSplitor(this->splitor_);
  // Allocate memory for block
  try {
    this->block_ = (char*)malloc(block_size_*1024*1024);
  } catch (std::bad_alloc&) {
    LOG(FATAL) << "Cannot allocate enough memory for data  \
                   block. Block size: " 
               << block_size_ << "MB. "
               << "You set change the block size via configuration.";
  }
  // Open file
#ifndef _MSC_VER
  file_ptr_ = OpenFileOrDie(filename_.c_str(), "r");
#else
  file_ptr_ = OpenFileOrDie(filename_.c_str(), "rb");
#endif
}